

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

StreamOut * prvTidyFileOutput(TidyDocImpl *doc,FILE *fp,int encoding,uint nl)

{
  StreamOut *pSVar1;
  
  pSVar1 = initStreamOut(doc,encoding,nl);
  prvTidyinitFileSink(&pSVar1->sink,fp);
  pSVar1->iotype = FileIO;
  return pSVar1;
}

Assistant:

StreamOut* TY_(FileOutput)( TidyDocImpl *doc, FILE* fp, int encoding, uint nl )
{
    StreamOut* out = initStreamOut( doc, encoding, nl );
    TY_(initFileSink)( &out->sink, fp );
    out->iotype = FileIO;
    return out;
}